

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeHeadTrackerDevice.cpp
# Opt level: O0

VRInputDevice *
MinVR::VRFakeHeadTrackerDevice::create
          (VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  VRAnyCoreType t;
  VRAnyCoreType t_00;
  VRAnyCoreType t_01;
  VRAnyCoreType t_02;
  bool bVar1;
  float *pfVar2;
  ostream *poVar3;
  VRInputDevice *pVVar4;
  string *in_RDX;
  VRFakeHeadTrackerDevice *in_RSI;
  undefined8 *in_RDI;
  float fVar5;
  VRFakeHeadTrackerDevice *dev;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mouseRotKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rightKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  leftKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  backKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  forwardKeys;
  VRMatrix4 lookAtMatrix;
  VRMatrix4 M2;
  VRMatrix4 M1;
  VRVector3 y;
  VRVector3 x;
  VRVector3 z;
  VRVector3 center;
  VRVector3 eye;
  VRVector3 up;
  VRMatrix4 headMatrix;
  float rScale;
  float tScale;
  string toggleEvent;
  string trackerName;
  string devNameSpace;
  VRMatrix4 *in_stack_fffffffffffff158;
  uint uVar6;
  VRMatrix4 *in_stack_fffffffffffff160;
  uint uVar7;
  VRVector3 *in_stack_fffffffffffff168;
  undefined4 uVar8;
  float in_stack_fffffffffffff170;
  undefined4 in_stack_fffffffffffff174;
  undefined4 in_stack_fffffffffffff178;
  undefined4 in_stack_fffffffffffff17c;
  undefined4 in_stack_fffffffffffff180;
  undefined4 in_stack_fffffffffffff184;
  undefined4 in_stack_fffffffffffff188;
  undefined4 in_stack_fffffffffffff18c;
  undefined4 in_stack_fffffffffffff190;
  undefined4 in_stack_fffffffffffff194;
  char *in_stack_fffffffffffff198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1a0;
  VRVector3 *in_stack_fffffffffffff1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff1b0;
  VRInputDevice *pVVar9;
  float in_stack_fffffffffffff1b8;
  float in_stack_fffffffffffff1bc;
  VRMatrix4 *in_stack_fffffffffffff1c0;
  VRMatrix4 *in_stack_fffffffffffff1c8;
  string *in_stack_fffffffffffff1d0;
  float r3c2;
  VRMatrix4 *in_stack_fffffffffffff1d8;
  float r3c3;
  VRDataIndex *in_stack_fffffffffffff1e0;
  VRDataIndex *in_stack_fffffffffffff1e8;
  undefined1 uVar10;
  string *in_stack_fffffffffffff1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *defaultVal;
  string *in_stack_fffffffffffff200;
  string *key;
  VRDataIndex *in_stack_fffffffffffff208;
  VRDataIndex *this;
  VRMatrix4 *in_stack_fffffffffffff218;
  VRFakeHeadTrackerDevice *in_stack_fffffffffffff390;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff398;
  VRAnyCoreType in_stack_fffffffffffff3a0;
  VRFakeHeadTrackerDevice *in_stack_fffffffffffff3a8;
  string *in_stack_fffffffffffff3b0;
  undefined6 in_stack_fffffffffffff3b8;
  byte in_stack_fffffffffffff3be;
  undefined1 in_stack_fffffffffffff3bf;
  VRFakeHeadTrackerDevice *in_stack_fffffffffffff3c0;
  VRDataIndex *in_stack_fffffffffffff3c8;
  undefined7 in_stack_fffffffffffff3d0;
  undefined1 in_stack_fffffffffffff3d7;
  VRFakeHeadTrackerDevice *in_stack_fffffffffffff3d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff3e0;
  bool local_c12;
  VRMatrix4 local_af0;
  VRInputDevice *local_aa8;
  string local_aa0 [39];
  allocator<char> local_a79;
  string local_a78 [63];
  allocator<char> local_a39;
  string local_a38 [56];
  string local_a00 [39];
  undefined1 local_9d9 [64];
  undefined1 local_999 [40];
  allocator<char> local_971;
  string local_970 [56];
  string local_938 [39];
  allocator<char> local_911;
  string local_910 [32];
  undefined1 local_8f0 [32];
  string local_8d0 [39];
  allocator<char> local_8a9;
  string local_8a8 [56];
  string local_870 [39];
  allocator<char> local_849;
  string local_848 [63];
  allocator<char> local_809;
  string local_808 [39];
  allocator<char> local_7e1;
  string local_7e0 [56];
  string local_7a8 [39];
  allocator<char> local_781;
  string local_780 [63];
  allocator<char> local_741;
  string local_740 [39];
  allocator<char> local_719;
  string local_718 [56];
  VRMatrix4 local_6e0;
  VRMatrix4 local_698;
  VRMatrix4 local_650;
  VRMatrix4 local_608;
  VRVector3 local_5c0;
  VRVector3 local_5a8;
  VRVector3 local_590;
  VRVector3 local_578;
  VRVector3 local_560;
  string local_548 [39];
  allocator<char> local_521;
  string local_520 [32];
  VRDatum_conflict *local_500;
  VRVector3 local_4f8;
  string local_4e0 [39];
  undefined1 local_4b9 [33];
  VRDatum_conflict *local_498;
  VRVector3 local_490;
  string local_478 [39];
  undefined1 local_451 [33];
  VRDatum_conflict *local_430;
  VRVector3 local_428;
  byte local_409;
  string local_408 [37];
  byte local_3e3;
  byte local_3e2;
  undefined1 local_3e1 [40];
  byte local_3b9;
  string local_3b8 [39];
  undefined1 local_391 [33];
  string local_370 [39];
  allocator<char> local_349;
  string local_348 [32];
  string local_328 [39];
  allocator<char> local_301;
  string local_300 [32];
  VRDatum_conflict *local_2e0;
  VRMatrix4 local_2d8;
  string local_290 [39];
  allocator<char> local_269;
  string local_268 [32];
  VRVector3 local_248;
  VRMatrix4 local_230;
  string local_1e8 [32];
  undefined4 local_1c8;
  allocator<char> local_1c1;
  string local_1c0 [36];
  float local_19c;
  string local_198 [32];
  undefined4 local_178;
  allocator<char> local_171;
  string local_170 [36];
  float local_14c;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [55];
  allocator<char> local_81;
  string local_80 [32];
  VRDatum_conflict *local_60;
  string local_58 [32];
  string local_38 [40];
  VRFakeHeadTrackerDevice *local_10;
  undefined8 *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::string::string(local_38,in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::__cxx11::string::string(local_b8,local_38);
  local_60 = (VRDatum_conflict *)
             VRDataIndex::getValue
                       (in_stack_fffffffffffff3c8,(string *)in_stack_fffffffffffff3c0,
                        (string *)
                        CONCAT17(in_stack_fffffffffffff3bf,
                                 CONCAT16(in_stack_fffffffffffff3be,in_stack_fffffffffffff3b8)),
                        SUB81((ulong)in_stack_fffffffffffff3b0 >> 0x38,0));
  VRDatumConverter::operator_cast_to_string
            ((VRDatumConverter<MinVR::VRDatum> *)in_stack_fffffffffffff158);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::__cxx11::string::string(local_148,local_38);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (in_stack_fffffffffffff208,in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             in_stack_fffffffffffff1f0,SUB81((ulong)in_stack_fffffffffffff1e8 >> 0x38,0));
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  local_178 = 0x3f800000;
  std::__cxx11::string::string(local_198,local_38);
  fVar5 = VRDataIndex::getValueWithDefault<float>
                    (in_stack_fffffffffffff1e8,(string *)in_stack_fffffffffffff1e0,
                     (float *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0,
                     SUB81((ulong)in_stack_fffffffffffff1c8 >> 0x38,0));
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  local_14c = fVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  local_1c8 = 0x3f800000;
  std::__cxx11::string::string(local_1e8,local_38);
  fVar5 = VRDataIndex::getValueWithDefault<float>
                    (in_stack_fffffffffffff1e8,(string *)in_stack_fffffffffffff1e0,
                     (float *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0,
                     SUB81((ulong)in_stack_fffffffffffff1c8 >> 0x38,0));
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  local_19c = fVar5;
  VRVector3::VRVector3
            ((VRVector3 *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170),
             (float)((ulong)in_stack_fffffffffffff168 >> 0x20),SUB84(in_stack_fffffffffffff168,0),
             (float)((ulong)in_stack_fffffffffffff160 >> 0x20));
  VRMatrix4::translation(in_stack_fffffffffffff1a8);
  VRVector3::~VRVector3(&local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::__cxx11::string::string(local_290,local_38);
  bVar1 = VRDataIndex::exists(in_stack_fffffffffffff1e0,(string *)in_stack_fffffffffffff1d8,
                              in_stack_fffffffffffff1d0,
                              SUB81((ulong)in_stack_fffffffffffff1c8 >> 0x38,0));
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator(&local_269);
  if (bVar1) {
    std::allocator<char>::allocator();
    uVar10 = (undefined1)((ulong)in_stack_fffffffffffff1e8 >> 0x38);
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
    std::__cxx11::string::string(local_328,local_38);
    local_2e0 = (VRDatum_conflict *)
                VRDataIndex::getValue
                          (in_stack_fffffffffffff3c8,(string *)in_stack_fffffffffffff3c0,
                           (string *)
                           CONCAT17(in_stack_fffffffffffff3bf,
                                    CONCAT16(in_stack_fffffffffffff3be,in_stack_fffffffffffff3b8)),
                           SUB81((ulong)in_stack_fffffffffffff3b0 >> 0x38,0));
    t.datum._4_4_ = in_stack_fffffffffffff184;
    t.datum._0_4_ = in_stack_fffffffffffff180;
    VRMatrix4::VRMatrix4
              ((VRMatrix4 *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),t);
    VRMatrix4::operator=(in_stack_fffffffffffff160,in_stack_fffffffffffff158);
    VRMatrix4::~VRMatrix4(&local_2d8);
    std::__cxx11::string::~string(local_328);
    std::__cxx11::string::~string(local_300);
    std::allocator<char>::~allocator(&local_301);
  }
  else {
    std::allocator<char>::allocator();
    local_3b8[0x26] = (string)0x0;
    local_3b8[0x25] = (string)0x0;
    local_3b9 = 0;
    local_3e2 = 0;
    local_3e3 = 0;
    local_409 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
    std::__cxx11::string::string(local_370,local_38);
    bVar1 = VRDataIndex::exists(in_stack_fffffffffffff1e0,(string *)in_stack_fffffffffffff1d8,
                                in_stack_fffffffffffff1d0,
                                SUB81((ulong)in_stack_fffffffffffff1c8 >> 0x38,0));
    local_c12 = false;
    if (bVar1) {
      in_stack_fffffffffffff3e0 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_391;
      in_stack_fffffffffffff3d8 = local_10;
      std::allocator<char>::allocator();
      local_3b8[0x26] = (string)0x1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
      local_3b8[0x25] = (string)0x1;
      std::__cxx11::string::string(local_3b8,local_38);
      local_3b9 = 1;
      in_stack_fffffffffffff3d7 =
           VRDataIndex::exists(in_stack_fffffffffffff1e0,(string *)in_stack_fffffffffffff1d8,
                               in_stack_fffffffffffff1d0,
                               SUB81((ulong)in_stack_fffffffffffff1c8 >> 0x38,0));
      local_c12 = false;
      if ((bool)in_stack_fffffffffffff3d7) {
        in_stack_fffffffffffff3c8 = (VRDataIndex *)local_3e1;
        in_stack_fffffffffffff3c0 = local_10;
        std::allocator<char>::allocator();
        local_3e2 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190))
        ;
        local_3e3 = 1;
        std::__cxx11::string::string(local_408,local_38);
        local_409 = 1;
        in_stack_fffffffffffff3bf =
             VRDataIndex::exists(in_stack_fffffffffffff1e0,(string *)in_stack_fffffffffffff1d8,
                                 in_stack_fffffffffffff1d0,
                                 SUB81((ulong)in_stack_fffffffffffff1c8 >> 0x38,0));
        local_c12 = (bool)in_stack_fffffffffffff3bf;
      }
    }
    fVar5 = SUB84(in_stack_fffffffffffff1d0,0);
    in_stack_fffffffffffff3be = local_c12;
    if ((local_409 & 1) != 0) {
      std::__cxx11::string::~string(local_408);
      in_stack_fffffffffffff3be = local_c12;
    }
    if ((local_3e3 & 1) != 0) {
      std::__cxx11::string::~string((string *)(local_3e1 + 1));
    }
    if ((local_3e2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_3e1);
    }
    if ((local_3b9 & 1) != 0) {
      std::__cxx11::string::~string(local_3b8);
    }
    if (((byte)local_3b8[0x25] & 1) != 0) {
      std::__cxx11::string::~string((string *)(local_391 + 1));
    }
    if (((byte)local_3b8[0x26] & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_391);
    }
    std::__cxx11::string::~string(local_370);
    std::__cxx11::string::~string(local_348);
    std::allocator<char>::~allocator(&local_349);
    if ((in_stack_fffffffffffff3be & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Warning : no HeadMatrix defined for ");
      uVar10 = (undefined1)((ulong)in_stack_fffffffffffff1e8 >> 0x38);
      poVar3 = std::operator<<(poVar3,local_38);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "Either Define HeadMatrix or LookAtUp, LookAtEye and LookAtCenter");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cerr,"Using default: ");
      poVar3 = MinVR::operator<<((ostream *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      in_stack_fffffffffffff3b0 = (string *)local_451;
      in_stack_fffffffffffff3a8 = local_10;
      std::allocator<char>::allocator();
      r3c3 = SUB84(in_stack_fffffffffffff1e0,0);
      r3c2 = SUB84(in_stack_fffffffffffff1d8,0);
      uVar6 = (uint)((ulong)in_stack_fffffffffffff158 >> 0x20);
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
      std::__cxx11::string::string(local_478,local_38);
      in_stack_fffffffffffff3a0 =
           VRDataIndex::getValue
                     (in_stack_fffffffffffff3c8,(string *)in_stack_fffffffffffff3c0,
                      (string *)
                      CONCAT17(in_stack_fffffffffffff3bf,
                               CONCAT16(in_stack_fffffffffffff3be,in_stack_fffffffffffff3b8)),
                      SUB81((ulong)in_stack_fffffffffffff3b0 >> 0x38,0));
      t_00.datum._4_4_ = in_stack_fffffffffffff184;
      t_00.datum._0_4_ = in_stack_fffffffffffff180;
      local_430 = in_stack_fffffffffffff3a0.datum;
      VRVector3::VRVector3
                ((VRVector3 *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),t_00);
      std::__cxx11::string::~string(local_478);
      std::__cxx11::string::~string((string *)(local_451 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_451);
      in_stack_fffffffffffff398 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_4b9;
      in_stack_fffffffffffff390 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
      std::__cxx11::string::string(local_4e0,local_38);
      local_498 = (VRDatum_conflict *)
                  VRDataIndex::getValue
                            (in_stack_fffffffffffff3c8,(string *)in_stack_fffffffffffff3c0,
                             (string *)
                             CONCAT17(in_stack_fffffffffffff3bf,
                                      CONCAT16(in_stack_fffffffffffff3be,in_stack_fffffffffffff3b8))
                             ,SUB81((ulong)in_stack_fffffffffffff3b0 >> 0x38,0));
      t_01.datum._4_4_ = in_stack_fffffffffffff184;
      t_01.datum._0_4_ = in_stack_fffffffffffff180;
      VRVector3::VRVector3
                ((VRVector3 *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),t_01);
      std::__cxx11::string::~string(local_4e0);
      std::__cxx11::string::~string((string *)(local_4b9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_4b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
      std::__cxx11::string::string(local_548,local_38);
      local_500 = (VRDatum_conflict *)
                  VRDataIndex::getValue
                            (in_stack_fffffffffffff3c8,(string *)in_stack_fffffffffffff3c0,
                             (string *)
                             CONCAT17(in_stack_fffffffffffff3bf,
                                      CONCAT16(in_stack_fffffffffffff3be,in_stack_fffffffffffff3b8))
                             ,SUB81((ulong)in_stack_fffffffffffff3b0 >> 0x38,0));
      t_02.datum._4_4_ = in_stack_fffffffffffff184;
      t_02.datum._0_4_ = in_stack_fffffffffffff180;
      VRVector3::VRVector3
                ((VRVector3 *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),t_02);
      std::__cxx11::string::~string(local_548);
      std::__cxx11::string::~string(local_520);
      std::allocator<char>::~allocator(&local_521);
      MinVR::operator-(in_stack_fffffffffffff168,(VRVector3 *)in_stack_fffffffffffff160);
      uVar7 = (uint)((ulong)in_stack_fffffffffffff160 >> 0x20);
      uVar8 = (undefined4)((ulong)in_stack_fffffffffffff168 >> 0x20);
      VRVector3::normalize
                ((VRVector3 *)CONCAT44(in_stack_fffffffffffff18c,in_stack_fffffffffffff188));
      VRVector3::operator=(&local_560,&local_578);
      VRVector3::~VRVector3(&local_578);
      VRVector3::cross(in_stack_fffffffffffff1a8,(VRVector3 *)in_stack_fffffffffffff1a0);
      VRVector3::normalize
                ((VRVector3 *)CONCAT44(in_stack_fffffffffffff18c,in_stack_fffffffffffff188));
      VRVector3::operator=(&local_590,&local_5a8);
      VRVector3::~VRVector3(&local_5a8);
      VRVector3::cross(in_stack_fffffffffffff1a8,(VRVector3 *)in_stack_fffffffffffff1a0);
      VRVector3::operator[](&local_590,0);
      VRVector3::operator[](&local_5c0,0);
      VRVector3::operator[](&local_560,0);
      VRVector3::operator[](&local_590,1);
      VRVector3::operator[](&local_5c0,1);
      VRVector3::operator[](&local_560,1);
      VRVector3::operator[](&local_590,2);
      VRVector3::operator[](&local_5c0,2);
      VRVector3::operator[](&local_560,2);
      VRMatrix4::fromRowMajorElements
                (in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8,
                 (float)((ulong)in_stack_fffffffffffff1b0 >> 0x20),
                 SUB84(in_stack_fffffffffffff1b0,0),
                 (float)((ulong)in_stack_fffffffffffff1a8 >> 0x20),
                 SUB84(in_stack_fffffffffffff1a8,0),
                 (float)((ulong)in_stack_fffffffffffff1a0 >> 0x20),
                 SUB84(in_stack_fffffffffffff1a0,0),fVar5,r3c2,r3c3,
                 SUB84(in_stack_fffffffffffff1e8,0),SUB84(in_stack_fffffffffffff1f0,0),
                 SUB84(in_stack_fffffffffffff1f8,0),SUB84(in_stack_fffffffffffff200,0),
                 SUB84(in_stack_fffffffffffff208,0));
      VRVector3::operator[](&local_490,0);
      VRVector3::operator[](&local_490,1);
      pfVar2 = VRVector3::operator[](&local_490,2);
      in_stack_fffffffffffff170 = -*pfVar2;
      in_stack_fffffffffffff190 = 0x3f800000;
      in_stack_fffffffffffff168 = (VRVector3 *)CONCAT44(uVar8,0x3f800000);
      in_stack_fffffffffffff160 = (VRMatrix4 *)((ulong)uVar7 << 0x20);
      in_stack_fffffffffffff158 = (VRMatrix4 *)((ulong)uVar6 << 0x20);
      VRMatrix4::fromRowMajorElements
                (in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8,
                 (float)((ulong)in_stack_fffffffffffff1b0 >> 0x20),
                 SUB84(in_stack_fffffffffffff1b0,0),
                 (float)((ulong)in_stack_fffffffffffff1a8 >> 0x20),
                 SUB84(in_stack_fffffffffffff1a8,0),
                 (float)((ulong)in_stack_fffffffffffff1a0 >> 0x20),
                 SUB84(in_stack_fffffffffffff1a0,0),fVar5,r3c2,r3c3,
                 SUB84(in_stack_fffffffffffff1e8,0),SUB84(in_stack_fffffffffffff1f0,0),
                 SUB84(in_stack_fffffffffffff1f8,0),SUB84(in_stack_fffffffffffff200,0),
                 SUB84(in_stack_fffffffffffff208,0));
      uVar10 = (undefined1)((ulong)in_stack_fffffffffffff1e8 >> 0x38);
      MinVR::operator*(in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0);
      VRMatrix4::inverse(in_stack_fffffffffffff218);
      VRMatrix4::operator=(in_stack_fffffffffffff160,in_stack_fffffffffffff158);
      VRMatrix4::~VRMatrix4(&local_6e0);
      VRMatrix4::~VRMatrix4(&local_698);
      VRMatrix4::~VRMatrix4(&local_650);
      VRMatrix4::~VRMatrix4(&local_608);
      VRVector3::~VRVector3(&local_5c0);
      VRVector3::~VRVector3(&local_590);
      VRVector3::~VRVector3(&local_560);
      VRVector3::~VRVector3(&local_4f8);
      VRVector3::~VRVector3(&local_490);
      VRVector3::~VRVector3(&local_428);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x186320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff160,(value_type *)in_stack_fffffffffffff158);
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator(&local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff160,(value_type *)in_stack_fffffffffffff158);
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator(&local_741);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::__cxx11::string::string(local_7a8,local_38);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffff208,in_stack_fffffffffffff200,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0,(bool)uVar10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170),
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170));
  std::__cxx11::string::~string(local_7a8);
  std::__cxx11::string::~string(local_780);
  std::allocator<char>::~allocator(&local_781);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1864d5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff160,(value_type *)in_stack_fffffffffffff158);
  std::__cxx11::string::~string(local_7e0);
  std::allocator<char>::~allocator(&local_7e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff160,(value_type *)in_stack_fffffffffffff158);
  std::__cxx11::string::~string(local_808);
  std::allocator<char>::~allocator(&local_809);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::__cxx11::string::string(local_870,local_38);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffff208,in_stack_fffffffffffff200,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0,(bool)uVar10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170),
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170));
  std::__cxx11::string::~string(local_870);
  std::__cxx11::string::~string(local_848);
  std::allocator<char>::~allocator(&local_849);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x18668a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff160,(value_type *)in_stack_fffffffffffff158);
  std::__cxx11::string::~string(local_8a8);
  std::allocator<char>::~allocator(&local_8a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff160,(value_type *)in_stack_fffffffffffff158);
  std::__cxx11::string::~string(local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)(local_8f0 + 0x1f));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::__cxx11::string::string(local_938,local_38);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffff208,in_stack_fffffffffffff200,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0,(bool)uVar10);
  this = (VRDataIndex *)local_8f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170),
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170));
  std::__cxx11::string::~string(local_938);
  std::__cxx11::string::~string(local_910);
  std::allocator<char>::~allocator(&local_911);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x18683f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff160,(value_type *)in_stack_fffffffffffff158);
  std::__cxx11::string::~string(local_970);
  std::allocator<char>::~allocator(&local_971);
  key = (string *)local_999;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff160,(value_type *)in_stack_fffffffffffff158);
  std::__cxx11::string::~string((string *)(local_999 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_999);
  defaultVal = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_9d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::__cxx11::string::string(local_a00,local_38);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (this,key,defaultVal,(string *)local_10,(bool)uVar10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170),
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170));
  std::__cxx11::string::~string(local_a00);
  std::__cxx11::string::~string((string *)(local_9d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_9d9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1869f4);
  uVar10 = (undefined1)((ulong)&local_a39 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff160,(value_type *)in_stack_fffffffffffff158);
  std::__cxx11::string::~string(local_a38);
  std::allocator<char>::~allocator(&local_a39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::__cxx11::string::string(local_aa0,local_38);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (this,key,defaultVal,(string *)local_10,(bool)uVar10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170),
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170));
  std::__cxx11::string::~string(local_aa0);
  std::__cxx11::string::~string(local_a78);
  std::allocator<char>::~allocator(&local_a79);
  pVVar4 = (VRInputDevice *)operator_new(0x1b0);
  VRMatrix4::VRMatrix4(in_stack_fffffffffffff160,in_stack_fffffffffffff158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffff1b0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff1a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffff1b0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff1a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffff1b0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff1a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffff1b0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff1a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffff1b0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff1a8);
  VRFakeHeadTrackerDevice
            (in_stack_fffffffffffff3c0,
             (string *)
             CONCAT17(in_stack_fffffffffffff3bf,
                      CONCAT16(in_stack_fffffffffffff3be,in_stack_fffffffffffff3b8)),
             in_stack_fffffffffffff3b0,(float)((ulong)in_stack_fffffffffffff3a8 >> 0x20),
             SUB84(in_stack_fffffffffffff3a8,0),(VRMatrix4 *)in_stack_fffffffffffff3a0.datum,
             in_stack_fffffffffffff398,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff390,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff3d8,in_stack_fffffffffffff3e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170));
  VRMatrix4::~VRMatrix4(&local_af0);
  pVVar9 = (VRInputDevice *)0x0;
  if (pVVar4 != (VRInputDevice *)0x0) {
    pVVar9 = pVVar4 + 1;
  }
  local_aa8 = pVVar4;
  (**(code **)*local_8)(local_8,pVVar9);
  pVVar4 = local_aa8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170));
  VRMatrix4::~VRMatrix4(&local_230);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return pVVar4;
}

Assistant:

VRInputDevice*
VRFakeHeadTrackerDevice::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace) {
    std::string devNameSpace = nameSpace;
  
    std::string trackerName = config->getValue("TrackerName", devNameSpace);
    std::string toggleEvent = config->getValueWithDefault("ToggleOnOffEvent", std::string("Kbd1_Down"), devNameSpace);
    float tScale = config->getValueWithDefault("TranslationScale", 1.0f, devNameSpace);
    float rScale = config->getValueWithDefault("RotationScale", 1.0f, devNameSpace);
    
    VRMatrix4 headMatrix = VRMatrix4::translation(VRVector3(0,0,4));
    if (config->exists("HeadMatrix", devNameSpace)){
        headMatrix = config->getValue("HeadMatrix", devNameSpace);
    }
    else if (config->exists("LookAtUp", devNameSpace) && config->exists("LookAtEye", devNameSpace) && config->exists("LookAtCenter", devNameSpace))
    {
        VRVector3 up = config->getValue("LookAtUp", devNameSpace);
        VRVector3 eye = config->getValue("LookAtEye", devNameSpace);
        VRVector3 center = config->getValue("LookAtCenter", devNameSpace);
        
        VRVector3 z = eye - center;
        z = z.normalize();
        VRVector3 x = up.cross(z);
        x = x.normalize();
        VRVector3 y = z.cross(x);
        
        VRMatrix4 M1 = VRMatrix4::fromRowMajorElements(x[0], y[0], z[0], 0,
                                                       x[1], y[1], z[1], 0,
                                                       x[2], y[2], z[2], 0,
                                                       0, 0, 0, 1);
        
        VRMatrix4 M2 = VRMatrix4::fromRowMajorElements(1, 0, 0, -eye[0],
                                                       0, 1, 0, -eye[1],
                                                       0, 0, 1, -eye[2],
                                                       0, 0, 0, 1);
        
        VRMatrix4 lookAtMatrix = M1 * M2;
        headMatrix = lookAtMatrix.inverse();
    }
    else {
        std::cerr << "Warning : no HeadMatrix defined for " << devNameSpace << std::endl;
        std::cerr << "Either Define HeadMatrix or LookAtUp, LookAtEye and LookAtCenter" << std::endl;
        std::cerr << "Using default: " << headMatrix << std::endl;
    }
    
    std::vector<std::string> forwardKeys;
    forwardKeys.push_back("KbdUp");
    forwardKeys.push_back("KbdW");
    forwardKeys = config->getValueWithDefault("ForwardKeys", forwardKeys, devNameSpace);
    
    std::vector<std::string> backKeys;
    backKeys.push_back("KbdDown");
    backKeys.push_back("KbdZ");
    backKeys = config->getValueWithDefault("BackKeys", backKeys, devNameSpace);
    
    std::vector<std::string> leftKeys;
    leftKeys.push_back("KbdLeft");
    leftKeys.push_back("KbdA");
    leftKeys = config->getValueWithDefault("LeftKeys", leftKeys, devNameSpace);
    
    std::vector<std::string> rightKeys;
    rightKeys.push_back("KbdRight");
    rightKeys.push_back("KbdS");
    rightKeys = config->getValueWithDefault("RightKeys", rightKeys, devNameSpace);

    std::vector<std::string> mouseRotKeys;
    mouseRotKeys.push_back("MouseBtnRight");
    mouseRotKeys = config->getValueWithDefault("MouseRotationKeys", mouseRotKeys, devNameSpace);
    
    VRFakeHeadTrackerDevice *dev = new VRFakeHeadTrackerDevice(trackerName, toggleEvent, tScale, rScale,
        headMatrix, forwardKeys, backKeys, leftKeys, rightKeys, mouseRotKeys);
    vrMain->addEventHandler(dev);

    return dev;
}